

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O3

void __thiscall KktChStep::printA(KktChStep *this)

{
  char *pcVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  undefined8 in_RAX;
  size_t sVar6;
  long lVar7;
  ostream *poVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  char buff [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
  if (0 < this->numCol) {
    lVar11 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      sprintf(pcVar1,"%2.1g ",
              (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar6);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------A-|-b-----\n",0x11);
  if (0 < this->numRow) {
    uVar12 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      if (0 < this->numCol) {
        lVar11 = 0;
        do {
          piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar5 = piVar2[lVar11];
          lVar7 = (long)iVar5;
          if (uVar12 == (uint)piVar3[lVar7]) {
            iVar9 = piVar2[lVar11 + 1];
          }
          else {
            iVar9 = piVar2[lVar11 + 1];
            if (iVar5 <= iVar9) {
              iVar5 = iVar9;
            }
            do {
              if (iVar5 == lVar7) goto LAB_0015216f;
              lVar4 = lVar7 + 1;
              lVar7 = lVar7 + 1;
            } while (uVar12 != (uint)piVar3[lVar4]);
            iVar5 = (int)lVar7;
          }
          if (iVar5 < iVar9) {
            sprintf(pcVar1,"%2.1g ",
                    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7]);
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar6 = strlen(pcVar1);
            pcVar10 = pcVar1;
          }
          else {
LAB_0015216f:
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar6 = 3;
            pcVar10 = "   ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar6);
          lVar11 = lVar11 + 1;
        } while (lVar11 < this->numCol);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |   ",6);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      poVar8 = std::ostream::_M_insert<double>
                         ((this->RrowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," < < ",5);
      poVar8 = std::ostream::_M_insert<double>
                         ((this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar12]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)this->numRow);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------l------\n",0xe);
  if (0 < this->numCol) {
    lVar11 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] <= -1e+200) {
        uStack_38 = CONCAT44(0x666e692d,(undefined4)uStack_38);
      }
      else {
        sprintf(pcVar1,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar6);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------u------\n",0xe);
  if (0 < this->numCol) {
    lVar11 = 0;
    pcVar1 = (char *)((long)&uStack_38 + 4);
    do {
      if (1e+200 <= (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11]) {
        uStack_38 = CONCAT44(0x666e69,(undefined4)uStack_38);
      }
      else {
        sprintf(pcVar1,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar6);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void KktChStep::printA() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------A-|-b-----\n";
	for (int i=0;i<numRow;i++) {
		for (int j=0;j<numCol;j++) {

			int ind = Astart[j];
			while (Aindex[ind]!=i && ind<Astart[j+1]) 
				ind++;
			//if a_ij is nonzero print
			if (Aindex[ind]==i && ind<Astart[j+1])
			{	
				sprintf(buff, "%2.1g ", Avalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
	}
	cout<<"------l------\n";
	for (int i=0;i<numCol;i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else 
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<numCol;i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else 
			sprintf(buff, "inf");
		cout<<setw(5)<<buff; 
	}
	cout<<endl;

}